

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_read_chunk(exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,void *packed_data)

{
  long lVar1;
  long in_RCX;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  bool bVar2;
  exr_const_priv_part_t part;
  _INTERNAL_EXR_READ_MODE rmode;
  int64_t nread;
  uint64_t toread;
  uint64_t dataoffset;
  exr_result_t rv;
  long local_48;
  long local_40;
  ulong local_38;
  exr_result_t local_2c;
  long local_28;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else if (*in_RDI == '\0') {
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RDX == (int *)0x0) {
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else if ((*(long *)(in_RDX + 8) == 0) || (in_RCX != 0)) {
        if ((*in_RDX < 0) || (*(int *)(lVar1 + 0xf4) <= *in_RDX)) {
          local_4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,3,"invalid chunk index (%d) vs part chunk count %d",*in_RDX,
                               *(undefined4 *)(lVar1 + 0xf4));
        }
        else if ((uint)*(byte *)((long)in_RDX + 0x16) == (*(uint *)(lVar1 + 4) & 0xff)) {
          if ((uint)*(byte *)((long)in_RDX + 0x17) == (*(uint *)(lVar1 + 0xb0) & 0xff)) {
            local_38 = *(ulong *)(in_RDX + 6);
            if ((*(long *)(in_RDI + 0x98) < 1) || (local_38 <= *(ulong *)(in_RDI + 0x98))) {
              bVar2 = *(int *)(lVar1 + 0xb0) == 0;
              local_40 = *(long *)(in_RDX + 8);
              if (local_40 == 0) {
                local_2c = 0;
              }
              else {
                local_48 = 0;
                local_28 = in_RCX;
                local_2c = (**(code **)(in_RDI + 0x28))
                                     (in_RDI,in_RCX,local_40,&local_38,&local_48,bVar2);
                if ((bVar2) && (local_48 < local_40)) {
                  memset((void *)(local_28 + local_48),0,local_40 - local_48);
                }
              }
              local_4 = local_2c;
            }
            else {
              local_4 = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,3,
                                   "chunk block info data offset (%lu) past end of file (%ld)",
                                   local_38,*(undefined8 *)(in_RDI + 0x98));
            }
          }
          else {
            local_4 = (**(code **)(in_RDI + 0x40))
                                (in_RDI,3,"mismatched compression type for chunk block info");
          }
        }
        else {
          local_4 = (**(code **)(in_RDI + 0x40))
                              (in_RDI,3,"mismatched storage type for chunk block info");
        }
      }
      else {
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,7);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_read_chunk (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    void*                   packed_data)
{
    exr_result_t                 rv;
    uint64_t                     dataoffset, toread;
    int64_t                      nread;
    enum _INTERNAL_EXR_READ_MODE rmode = EXR_MUST_READ_ALL;
    EXR_READONLY_AND_DEFINE_PART (part_index);

    if (!cinfo) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);
    if (cinfo->packed_size > 0 && !packed_data)
        return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    if (cinfo->idx < 0 || cinfo->idx >= part->chunk_count)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "invalid chunk index (%d) vs part chunk count %d",
            cinfo->idx,
            part->chunk_count);
    if (cinfo->type != (uint8_t) part->storage_mode)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "mismatched storage type for chunk block info");
    if (cinfo->compression != (uint8_t) part->comp_type)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "mismatched compression type for chunk block info");

    dataoffset = cinfo->data_offset;
    if (ctxt->file_size > 0 && dataoffset > (uint64_t) ctxt->file_size)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "chunk block info data offset (%" PRIu64
            ") past end of file (%" PRId64 ")",
            dataoffset,
            ctxt->file_size);

    /* allow a short read if uncompressed */
    if (part->comp_type == EXR_COMPRESSION_NONE) rmode = EXR_ALLOW_SHORT_READ;

    toread = cinfo->packed_size;
    if (toread > 0)
    {
        nread = 0;
        rv    = ctxt->do_read (
            ctxt, packed_data, toread, &dataoffset, &nread, rmode);

        if (rmode == EXR_ALLOW_SHORT_READ && nread < (int64_t) toread)
            memset (
                ((uint8_t*) packed_data) + nread,
                0,
                toread - (uint64_t) (nread));
    }
    else
        rv = EXR_ERR_SUCCESS;

    return rv;
}